

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall CVmByteArraySource::readc(CVmByteArraySource *this,void *buf,size_t len)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = this->idx;
  sVar2 = this->end_idx - lVar1;
  if ((long)(lVar1 + len) <= this->end_idx) {
    sVar2 = len;
  }
  sVar2 = CVmObjByteArray::copy_to_buf(this->arr,(uchar *)buf,lVar1 + 1,sVar2);
  this->idx = this->idx + sVar2;
  return (int)sVar2;
}

Assistant:

virtual int readc(void *buf, size_t len)
    {
        /* limit the read to the available length */
        size_t rdlen = (idx + (long)len > end_idx
                        ? (size_t)(end_idx - idx) : len);

        /* copy the requested bytes */
        size_t copied = arr->copy_to_buf((unsigned char *)buf, idx + 1, rdlen);

        /* move past the bytes copied */
        idx += copied;

        /* return the number of bytes actually read */
        return copied;
    }